

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,duckdb_fmt::v6::internal::error_handler>::char_writer>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,format_specs *specs,char_writer *f
          )

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  checked_ptr<typename_buffer<char>::value_type> __s;
  char __tmp;
  checked_ptr<typename_buffer<char>::value_type> pcVar4;
  size_t __len_1;
  ulong __n;
  size_t __len;
  ulong uVar5;
  
  uVar2 = specs->width;
  uVar5 = (ulong)uVar2;
  if (uVar5 < 2) {
    pcVar4 = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                       ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> *)this,1);
    *pcVar4 = f->value;
    return;
  }
  __s = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                  ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> *)this,uVar5);
  bVar1 = (specs->fill).data_[0];
  uVar5 = uVar5 - 1;
  bVar3 = specs->field_0x9 & 0xf;
  pcVar4 = __s;
  if (bVar3 == 3) {
    __n = uVar5 >> 1;
    if (uVar2 != 2) {
      pcVar4 = __s + __n;
      switchD_014c69ad::default(__s,(uint)bVar1,__n);
    }
    *pcVar4 = f->value;
    uVar5 = uVar5 - __n;
  }
  else {
    if (bVar3 == 2) {
      switchD_014c69ad::default(__s,(uint)bVar1,uVar5);
      __s[uVar5] = f->value;
      return;
    }
    *__s = f->value;
  }
  switchD_014c69ad::default(pcVar4 + 1,(uint)bVar1,uVar5);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }